

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::QToolBarLayout(QToolBarLayout *this,QWidget *parent)

{
  QToolBar *pQVar1;
  void *pvVar2;
  QToolBarLayout *in_RSI;
  QToolBarExtension *in_RDI;
  long in_FS_OFFSET;
  QToolBar *tb;
  QWidget *in_stack_ffffffffffffffd8;
  undefined1 set;
  QToolBarExtension *this_00;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QLayout::QLayout(&in_RSI->super_QLayout,in_stack_ffffffffffffffd8);
  *(undefined ***)&(in_RDI->super_QToolButton).super_QAbstractButton.super_QWidget =
       &PTR_metaObject_00d1ee88;
  *(undefined ***)
   &(in_RDI->super_QToolButton).super_QAbstractButton.super_QWidget.super_QPaintDevice =
       &PTR__QToolBarLayout_00d1ef90;
  (in_RDI->super_QToolButton).super_QAbstractButton.super_QWidget.field_0x1c = 0;
  (in_RDI->super_QToolButton).super_QAbstractButton.super_QWidget.field_0x1d = 0;
  QList<QToolBarItem_*>::QList((QList<QToolBarItem_*> *)0x6fbb29);
  QSize::QSize((QSize *)in_RDI);
  QSize::QSize((QSize *)in_RDI);
  in_RDI[1].super_QToolButton.super_QAbstractButton.super_QWidget.field_0x18 = 1;
  in_RDI[1].super_QToolButton.super_QAbstractButton.super_QWidget.field_0x19 = 0;
  in_RDI[1].super_QToolButton.super_QAbstractButton.super_QWidget.field_0x1a = 1;
  in_RDI[1].super_QToolButton.super_QAbstractButton.super_QWidget.field_0x1b = 0;
  QList<QLayoutStruct>::QList((QList<QLayoutStruct> *)0x6fbb63);
  QRect::QRect((QRect *)in_RDI);
  in_RDI[2].super_QToolButton.super_QAbstractButton.super_QWidget.data = (QWidgetData *)0x0;
  pQVar1 = qobject_cast<QToolBar*>((QObject *)0x6fbb8b);
  if (pQVar1 != (QToolBar *)0x0) {
    pvVar2 = operator_new(0x30);
    QToolBarExtension::QToolBarExtension(this_00,(QWidget *)in_RSI);
    *(void **)&in_RDI[2].super_QToolButton.super_QAbstractButton.super_QWidget.field_0x18 = pvVar2;
    QWidget::setFocusPolicy((QWidget *)in_RDI,(FocusPolicy)((ulong)pvVar2 >> 0x20));
    QWidget::hide((QWidget *)0x6fbbde);
    QObject::connect((QObject *)&local_10,(char *)pQVar1,
                     (QObject *)"2orientationChanged(Qt::Orientation)",
                     *(char **)&in_RDI[2].super_QToolButton.super_QAbstractButton.super_QWidget.
                                field_0x18,0xb28eec);
    set = (undefined1)((ulong)pQVar1 >> 0x38);
    QMetaObject::Connection::~Connection(&local_10);
    QWidget::parentWidget((QWidget *)0x6fbc1b);
    qobject_cast<QMainWindow*>((QObject *)0x6fbc23);
    setUsePopupMenu(in_RSI,(bool)set);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QToolBarLayout::QToolBarLayout(QWidget *parent)
    : QLayout(parent), expanded(false), animating(false), dirty(true),
        expanding(false), empty(true), expandFlag(false), popupMenu(nullptr)
{
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (!tb)
        return;

    extension = new QToolBarExtension(tb);
    extension->setFocusPolicy(Qt::NoFocus);
    extension->hide();
    QObject::connect(tb, SIGNAL(orientationChanged(Qt::Orientation)),
                     extension, SLOT(setOrientation(Qt::Orientation)));

    setUsePopupMenu(qobject_cast<QMainWindow*>(tb->parentWidget()) == 0);
}